

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O3

DoublePoint ClipperLib::GetUnitNormal(IntPoint *pt1,IntPoint *pt2)

{
  double dVar1;
  double dVar2;
  double dVar3;
  DoublePoint DVar4;
  
  dVar2 = 0.0;
  dVar1 = 0.0;
  if (pt2->Y != pt1->Y || pt2->X != pt1->X) {
    dVar2 = (double)(pt2->X - pt1->X);
    dVar1 = (double)(pt2->Y - pt1->Y);
    dVar3 = 1.0 / SQRT(dVar2 * dVar2 + dVar1 * dVar1);
    dVar1 = dVar1 * dVar3;
    dVar2 = -dVar3 * dVar2;
  }
  DVar4.Y = dVar2;
  DVar4.X = dVar1;
  return DVar4;
}

Assistant:

DoublePoint GetUnitNormal( const IntPoint &pt1, const IntPoint &pt2)
{
  if(pt2.X == pt1.X && pt2.Y == pt1.Y) 
    return DoublePoint(0, 0);

  double dx = (double)(pt2.X - pt1.X);
  double dy = (double)(pt2.Y - pt1.Y);
  double f = 1 *1.0/ std::sqrt( dx*dx + dy*dy );
  dx *= f;
  dy *= f;
  return DoublePoint(dy, -dx);
}